

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O1

ON_2dVector __thiscall ON_2dVector::operator*(ON_2dVector *this,ON_Xform *xform)

{
  ON_2dVector local_18;
  
  ON_2dVector(&local_18,xform->m_xform[0][0] * this->x + xform->m_xform[1][0] * this->y,
              this->x * xform->m_xform[0][1] + this->y * xform->m_xform[1][1]);
  return local_18;
}

Assistant:

ON_2dVector ON_2dVector::operator*( const ON_Xform& xform ) const
{
  const double vx = x; // optimizer should put vx,vy in registers
  const double vy = y;
  double hx[2];
  const double* m = &xform.m_xform[0][0];
  hx[0] = m[0]*vx + m[4]*vy;
  hx[1] = m[1]*vx + m[5]*vy;
  return ON_2dVector( hx[0],hx[1] );
}